

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

unique_ptr<char_*[],_std::default_delete<char_*[]>_> __thiscall
testing::internal::CreateArgvFromArgs
          (internal *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  void *__s;
  long lVar2;
  pointer pbVar3;
  long lVar4;
  ulong __n;
  
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pbVar1 - (long)pbVar3 >> 5;
  __n = -(ulong)(lVar4 + 1U >> 0x3d != 0) | lVar4 * 8 + 8U;
  __s = operator_new__(__n);
  memset(__s,0,__n);
  *(void **)this = __s;
  if (pbVar1 != pbVar3) {
    lVar2 = 0;
    do {
      *(pointer *)((long)__s + lVar2 * 8) = (pbVar3->_M_dataplus)._M_p;
      lVar2 = lVar2 + 1;
      pbVar3 = pbVar3 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar2);
  }
  *(undefined8 *)((long)__s + lVar4 * 8) = 0;
  return (__uniq_ptr_data<char_*,_std::default_delete<char_*[]>,_true,_true>)
         (__uniq_ptr_data<char_*,_std::default_delete<char_*[]>,_true,_true>)this;
}

Assistant:

std::unique_ptr<char*[]> CreateArgvFromArgs(std::vector<std::string>& args) {
  auto result = std::make_unique<char*[]>(args.size() + 1);
  for (size_t i = 0; i < args.size(); ++i) {
    result[i] = &args[i][0];
  }
  result[args.size()] = nullptr;  // extra null terminator
  return result;
}